

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

int file_write(BIO *b,char *in,int inl)

{
  size_t sVar1;
  
  if (b->init == 0) {
    inl = 0;
  }
  else {
    sVar1 = fwrite(in,(long)inl,1,(FILE *)b->ptr);
    if ((int)sVar1 < 1) {
      inl = (int)sVar1;
    }
  }
  return inl;
}

Assistant:

static int file_write(BIO *b, const char *in, int inl) {
  if (!b->init) {
    return 0;
  }

  int ret = (int)fwrite(in, inl, 1, (FILE *)b->ptr);
  if (ret > 0) {
    ret = inl;
  }
  return ret;
}